

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

void btreeblk_remove(void *voidhandle,bid_t bid)

{
  undefined8 *puVar1;
  long lVar2;
  btreeblk_handle *handle;
  
  if ((char)(bid >> 0x30) == '\0') {
LAB_0011c945:
    *(long *)((long)voidhandle + 8) = *(long *)((long)voidhandle + 8) + -1;
    filemgr_add_stale_block
              (*(filemgr **)((long)voidhandle + 0x38),(bid & 0xffffffffffff) * (ulong)*voidhandle,
               (ulong)*voidhandle);
    return;
  }
  lVar2 = (ulong)((uint)(bid >> 0x35) & 7) - 1;
  if (*(ulong *)(*(long *)((long)voidhandle + 0x60) + lVar2 * 0x18) == (bid & 0xffffffffffff)) {
    *(undefined1 *)
     (*(long *)(*(long *)((long)voidhandle + 0x60) + lVar2 * 0x18 + 0x10) +
     (ulong)((ushort)(bid >> 0x30) & 0x1f)) = 0;
    puVar1 = (undefined8 *)(*(long *)((long)voidhandle + 0x60) + lVar2 * 0x18);
    if ((*(short *)((long)puVar1 + 0xc) == 0) || (puVar1[2] == 0)) {
      *puVar1 = 0xffffffffffffffff;
      goto LAB_0011c945;
    }
  }
  return;
}

Assistant:

void btreeblk_remove(void *voidhandle, bid_t bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    bid_t _bid;
    int i, subblock, nitems;
    size_t sb, idx;

    sb = idx = 0;
    subbid2bid(bid, &sb, &idx, &_bid);
    subblock = is_subblock(bid);

    if (subblock) {
        // subblock
        if (handle->sb[sb].bid == _bid) {
            // erase bitmap
            handle->sb[sb].bitmap[idx] = 0;
            // if all slots are empty, invalidate the block
            nitems = 0;
            for (i=0;i<handle->sb[sb].nblocks;++i){
                if (handle->sb[sb].bitmap) {
                    nitems++;
                }
            }
            if (nitems == 0) {
                handle->sb[sb].bid = BLK_NOT_FOUND;
                handle->nlivenodes--;
                _btreeblk_add_stale_block(handle,
                                          _bid * handle->nodesize,
                                          handle->nodesize);
            }
        }
    } else {
        // normal block
        handle->nlivenodes--;
        _btreeblk_add_stale_block(handle,
                                  _bid * handle->nodesize,
                                  handle->nodesize);
    }
}